

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsa_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  PaAlsaHostApiRepresentation *alsaApi;
  PaUtilAllocationGroup *pPVar4;
  char *pcVar5;
  PaError PVar6;
  
  alsa_snd_pcm_hw_params_get_buffer_size = snd_pcm_hw_params_get_buffer_size;
  alsaApi = (PaAlsaHostApiRepresentation *)PaUtil_AllocateMemory(0x118);
  if (alsaApi == (PaAlsaHostApiRepresentation *)0x0) {
    pcVar5 = 
    "Expression \'alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory( sizeof(PaAlsaHostApiRepresentation) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 747\n"
    ;
  }
  else {
    pPVar4 = PaUtil_CreateAllocationGroup();
    alsaApi->allocations = pPVar4;
    if (pPVar4 != (PaUtilAllocationGroup *)0x0) {
      alsaApi->hostApiIndex = hostApiIndex;
      pcVar5 = (char *)snd_asoundlib_version();
      iVar1 = atoi(pcVar5);
      iVar2 = atoi(pcVar5 + 2);
      uVar3 = atoi(pcVar5 + 4);
      alsaApi->alsaLibVersion = uVar3 | iVar1 << 0x10 | iVar2 << 8;
      *hostApi = (PaUtilHostApiRepresentation *)alsaApi;
      (alsaApi->baseHostApiRep).info.structVersion = 1;
      (alsaApi->baseHostApiRep).info.type = paALSA;
      (alsaApi->baseHostApiRep).info.name = "ALSA";
      (*hostApi)->Terminate = Terminate;
      (*hostApi)->OpenStream = OpenStream;
      (*hostApi)->IsFormatSupported = IsFormatSupported;
      paUtilErr_ = BuildDeviceList(alsaApi);
      if (paUtilErr_ < 0) {
        pcVar5 = 
        "Expression \'BuildDeviceList( alsaHostApi )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 766\n"
        ;
      }
      else {
        PaUtil_InitializeStreamInterface
                  (&alsaApi->callbackStreamInterface,CloseStream,StartStream,StopStream,AbortStream,
                   IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,PaUtil_DummyRead,
                   PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,PaUtil_DummyGetWriteAvailable);
        PaUtil_InitializeStreamInterface
                  (&alsaApi->blockingStreamInterface,CloseStream,StartStream,StopStream,AbortStream,
                   IsStreamStopped,IsStreamActive,GetStreamTime,PaUtil_DummyGetCpuLoad,ReadStream,
                   WriteStream,GetStreamReadAvailable,GetStreamWriteAvailable);
        paUtilErr_ = PaUnixThreading_Initialize();
        if (-1 < paUtilErr_) {
          return 0;
        }
        pcVar5 = 
        "Expression \'PaUnixThreading_Initialize()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 786\n"
        ;
      }
      PaUtil_DebugPrint(pcVar5);
      PVar6 = paUtilErr_;
      goto LAB_0010df03;
    }
    pcVar5 = 
    "Expression \'alsaHostApi->allocations = PaUtil_CreateAllocationGroup()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 748\n"
    ;
  }
  PaUtil_DebugPrint(pcVar5);
  PVar6 = -0x2708;
LAB_0010df03:
  if (alsaApi != (PaAlsaHostApiRepresentation *)0x0) {
    if (alsaApi->allocations != (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeAllAllocations(alsaApi->allocations);
      PaUtil_DestroyAllocationGroup(alsaApi->allocations);
    }
    PaUtil_FreeMemory(alsaApi);
  }
  return PVar6;
}

Assistant:

PaError PaAlsa_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = NULL;

    /* Try loading Alsa library. */
    if (!PaAlsa_LoadLibrary())
        return paHostApiNotFound;

    PA_UNLESS( alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory(
                sizeof(PaAlsaHostApiRepresentation) ), paInsufficientMemory );
    PA_UNLESS( alsaHostApi->allocations = PaUtil_CreateAllocationGroup(), paInsufficientMemory );
    alsaHostApi->hostApiIndex = hostApiIndex;
    alsaHostApi->alsaLibVersion = PaAlsaVersionNum();

    *hostApi = (PaUtilHostApiRepresentation*)alsaHostApi;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paALSA;
    (*hostApi)->info.name = "ALSA";

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;

    /** If AlsaErrorHandler is to be used, do not forget to unregister callback pointer in
        Terminate function.
    */
    /*ENSURE_( snd_lib_error_set_handler(AlsaErrorHandler), paUnanticipatedHostError );*/

    PA_ENSURE( BuildDeviceList( alsaHostApi ) );

    PaUtil_InitializeStreamInterface( &alsaHostApi->callbackStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable,
                                      PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &alsaHostApi->blockingStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream,
                                      GetStreamReadAvailable,
                                      GetStreamWriteAvailable );

    PA_ENSURE( PaUnixThreading_Initialize() );

    return result;

error:
    if( alsaHostApi )
    {
        if( alsaHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( alsaHostApi->allocations );
            PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
        }

        PaUtil_FreeMemory( alsaHostApi );
    }

    return result;
}